

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O2

int __thiscall QNetworkReplyFileImpl::close(QNetworkReplyFileImpl *this,int __fd)

{
  long lVar1;
  bool bVar2;
  IfNotOldStyleArgs<bool> IVar3;
  int iVar4;
  undefined7 extraout_var;
  long lVar5;
  long lVar6;
  undefined7 extraout_var_00;
  QObject *obj;
  
  lVar1 = *(long *)(this + 8);
  QNetworkReply::close((QNetworkReply *)this,__fd);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x238));
  if (!bVar2) {
    return (int)CONCAT71(extraout_var,bVar2);
  }
  lVar5 = QObject::thread();
  lVar6 = QObject::thread();
  if (lVar5 != lVar6) {
    if ((*(long *)(lVar1 + 0x238) == 0) || (*(int *)(*(long *)(lVar1 + 0x238) + 4) == 0)) {
      obj = (QObject *)0x0;
    }
    else {
      obj = *(QObject **)(lVar1 + 0x240);
    }
    IVar3 = QMetaObject::invokeMethod<>(obj,"close",QueuedConnection);
    return (int)CONCAT71(extraout_var_00,IVar3);
  }
  iVar4 = (**(code **)(**(long **)(lVar1 + 0x240) + 0x70))();
  return iVar4;
}

Assistant:

void QNetworkReplyFileImpl::close()
{
    Q_D(QNetworkReplyFileImpl);
    QNetworkReply::close();
    if (d->realFile) {
        if (d->realFile->thread() == thread())
            d->realFile->close();
        else
            QMetaObject::invokeMethod(d->realFile, "close", Qt::QueuedConnection);
    }
}